

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void nni_pipe_add_stat(nni_pipe *p,nni_stat_item *item)

{
  nni_stat_item *item_local;
  nni_pipe *p_local;
  
  nni_stat_add(&p->st_root,item);
  return;
}

Assistant:

void
nni_pipe_add_stat(nni_pipe *p, nni_stat_item *item)
{
#ifdef NNG_ENABLE_STATS
	nni_stat_add(&p->st_root, item);
#else
	NNI_ARG_UNUSED(p);
	NNI_ARG_UNUSED(item);
#endif
}